

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O0

bool absl::raw_log_internal::anon_unknown_0::VADoRawLog
               (char **buf,int *size,char *format,__va_list_tag *ap)

{
  bool local_35;
  int local_34;
  bool result;
  int n;
  __va_list_tag *ap_local;
  char *format_local;
  int *size_local;
  char **buf_local;
  
  if (*size < 0) {
    buf_local._7_1_ = false;
  }
  else {
    local_34 = vsnprintf(*buf,(long)*size,format,ap);
    local_35 = true;
    if ((local_34 < 0) || (*size < local_34)) {
      local_35 = false;
      if ((uint)*size < 0x1b) {
        local_34 = 0;
      }
      else {
        local_34 = *size + -0x1a;
      }
    }
    *size = *size - local_34;
    *buf = *buf + local_34;
    buf_local._7_1_ = local_35;
  }
  return buf_local._7_1_;
}

Assistant:

bool VADoRawLog(char** buf, int* size, const char* format, va_list ap) {
  if (*size < 0) return false;
  int n = vsnprintf(*buf, static_cast<size_t>(*size), format, ap);
  bool result = true;
  if (n < 0 || n > *size) {
    result = false;
    if (static_cast<size_t>(*size) > sizeof(kTruncated)) {
      n = *size - static_cast<int>(sizeof(kTruncated));
    } else {
      n = 0;  // no room for truncation message
    }
  }
  *size -= n;
  *buf += n;
  return result;
}